

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O3

void __thiscall
slang::SourceSnippet::highlightRange
          (SourceSnippet *this,SourceRange range,SourceLocation caretLoc,size_t col,
          string_view sourceLine)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar4 = (ulong)range.startLoc >> 0x1c;
  uVar3 = (ulong)range.endLoc >> 0x1c;
  uVar1 = (((ulong)caretLoc >> 0x1c) - col) + 1;
  if (uVar4 <= uVar1) {
    uVar4 = uVar1;
  }
  uVar6 = sourceLine._M_len + uVar1;
  if (uVar3 < sourceLine._M_len + uVar1) {
    uVar6 = uVar3;
  }
  if (uVar6 <= uVar4) {
    return;
  }
  sVar7 = uVar6 - uVar1;
  uVar1 = ~((ulong)caretLoc >> 0x1c);
  while ((sourceLine._M_str[uVar4 + uVar1 + col] == '\t' ||
         (sourceLine._M_str[uVar4 + uVar1 + col] == ' '))) {
    uVar4 = uVar4 + 1;
    if (uVar4 == uVar6) {
      return;
    }
  }
  lVar5 = uVar4 - uVar6;
  while ((sourceLine._M_str[sVar7 - 1] == ' ' || (sourceLine._M_str[sVar7 - 1] == '\t'))) {
    sVar7 = sVar7 - 1;
    lVar5 = lVar5 + 1;
    if (lVar5 == 0) {
      return;
    }
  }
  sVar2 = getColumnForByte(this,uVar1 + col + uVar4);
  sVar7 = getColumnForByte(this,sVar7);
  if (sVar7 < sVar2) {
    assert::assertFailed
              ("startCol <= endCol",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/diagnostics/TextDiagnosticClient.cpp"
               ,0xfc,
               "void slang::SourceSnippet::highlightRange(SourceRange, SourceLocation, size_t, string_view)"
              );
  }
  if ((this->highlightLine)._M_string_length < sVar7) {
    std::__cxx11::string::resize((ulong)&this->highlightLine,(char)sVar7);
  }
  if (sVar7 - sVar2 == 0) {
    return;
  }
  memset((this->highlightLine)._M_dataplus._M_p + sVar2,0x7e,sVar7 - sVar2);
  return;
}

Assistant:

void highlightRange(SourceRange range, SourceLocation caretLoc, size_t col,
                        string_view sourceLine) {
        // Trim the range so that it only falls on the same line as the cursor
        size_t start = range.start().offset();
        size_t end = range.end().offset();
        size_t startOfLine = caretLoc.offset() - (col - 1);
        size_t endOfLine = startOfLine + sourceLine.length();
        if (start < startOfLine)
            start = startOfLine;
        if (end > endOfLine)
            end = endOfLine;

        if (start >= end)
            return;

        // walk the range in to skip any leading or trailing whitespace
        start -= startOfLine;
        end -= startOfLine;
        while (sourceLine[start] == ' ' || sourceLine[start] == '\t') {
            start++;
            if (start == end)
                return;
        }
        while (sourceLine[end - 1] == ' ' || sourceLine[end - 1] == '\t') {
            end--;
            if (start == end)
                return;
        }

        size_t startCol = getColumnForByte(start);
        size_t endCol = getColumnForByte(end);
        ASSERT(startCol <= endCol);

        if (highlightLine.size() < endCol)
            highlightLine.resize(endCol, ' ');

        std::fill(highlightLine.begin() + ptrdiff_t(startCol),
                  highlightLine.begin() + ptrdiff_t(endCol), '~');
    }